

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O3

wchar_t strncat_from_utf8_libarchive2
                  (archive_string *as,void *_p,size_t len,archive_string_conv *sc)

{
  wchar_t wVar1;
  archive_string *paVar2;
  size_t sVar3;
  archive_string *paVar4;
  char *pcVar5;
  wchar_t wVar6;
  char *__s;
  size_t sVar7;
  uint32_t unicode;
  mbstate_t_conflict shift_state;
  wchar_t local_4c;
  archive_string *local_48;
  mbstate_t local_40;
  size_t local_38;
  
  local_40.__count = 0;
  local_40.__value = (_union_27)0x0;
  paVar2 = archive_string_ensure(as,len + as->length + 1);
  wVar1 = L'\xffffffff';
  if (paVar2 != (archive_string *)0x0) {
    pcVar5 = as->s;
    local_38 = as->buffer_length;
    __s = pcVar5 + as->length;
    local_48 = as;
    sVar3 = __ctype_get_mb_cur_max();
    wVar1 = _utf8_to_unicode((uint32_t *)&local_4c,(char *)_p,len);
    if (wVar1 != L'\0') {
      pcVar5 = pcVar5 + ~sVar3 + local_38;
      do {
        paVar2 = local_48;
        if (pcVar5 <= __s) {
          sVar7 = (long)__s - (long)local_48->s;
          local_48->length = sVar7;
          paVar4 = archive_string_ensure(local_48,sVar7 + len * 2 + 1);
          if (paVar4 == (archive_string *)0x0) {
            return L'\xffffffff';
          }
          pcVar5 = paVar2->s;
          __s = pcVar5 + paVar2->length;
          sVar7 = paVar2->buffer_length;
          sVar3 = __ctype_get_mb_cur_max();
          pcVar5 = pcVar5 + ~sVar3 + sVar7;
        }
        wVar6 = L'?';
        if (L'\xffffffff' < wVar1) {
          wVar6 = local_4c;
        }
        sVar3 = wcrtomb(__s,wVar6,&local_40);
        if ((int)sVar3 == -1) {
          return L'\xffffffff';
        }
        wVar6 = -wVar1;
        if (L'\0' < wVar1) {
          wVar6 = wVar1;
        }
        len = len - (uint)wVar6;
        _p = (void *)((long)_p + (ulong)(uint)wVar6);
        __s = __s + (int)sVar3;
        wVar1 = _utf8_to_unicode((uint32_t *)&local_4c,(char *)_p,len);
      } while (wVar1 != L'\0');
    }
    local_48->length = (long)__s - (long)local_48->s;
    *__s = '\0';
    wVar1 = L'\0';
  }
  return wVar1;
}

Assistant:

static int
strncat_from_utf8_libarchive2(struct archive_string *as,
    const void *_p, size_t len, struct archive_string_conv *sc)
{
	const char *s;
	int n;
	char *p;
	char *end;
	uint32_t unicode;
#if HAVE_WCRTOMB
	mbstate_t shift_state;

	memset(&shift_state, 0, sizeof(shift_state));
#else
	/* Clear the shift state before starting. */
	wctomb(NULL, L'\0');
#endif
	(void)sc; /* UNUSED */
	/*
	 * Allocate buffer for MBS.
	 * We need this allocation here since it is possible that
	 * as->s is still NULL.
	 */
	if (archive_string_ensure(as, as->length + len + 1) == NULL)
		return (-1);

	s = (const char *)_p;
	p = as->s + as->length;
	end = as->s + as->buffer_length - MB_CUR_MAX -1;
	while ((n = _utf8_to_unicode(&unicode, s, len)) != 0) {
		wchar_t wc;

		if (p >= end) {
			as->length = p - as->s;
			/* Re-allocate buffer for MBS. */
			if (archive_string_ensure(as,
			    as->length + len * 2 + 1) == NULL)
				return (-1);
			p = as->s + as->length;
			end = as->s + as->buffer_length - MB_CUR_MAX -1;
		}

		/*
		 * As libarchive 2.x, translates the UTF-8 characters into
		 * wide-characters in the assumption that WCS is Unicode.
		 */
		if (n < 0) {
			n *= -1;
			wc = L'?';
		} else
			wc = (wchar_t)unicode;

		s += n;
		len -= n;
		/*
		 * Translates the wide-character into the current locale MBS.
		 */
#if HAVE_WCRTOMB
		n = (int)wcrtomb(p, wc, &shift_state);
#else
		n = (int)wctomb(p, wc);
#endif
		if (n == -1)
			return (-1);
		p += n;
	}
	as->length = p - as->s;
	as->s[as->length] = '\0';
	return (0);
}